

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugRenderViewportThumbnail
               (ImDrawList *draw_list,ImGuiViewportP_conflict1 *viewport,ImRect *bb)

{
  ImVector<ImGuiWindow_*>_conflict *this;
  float alpha_mul;
  ImVec2 IVar1;
  ImDrawList *pIVar2;
  ImGuiWindow *this_00;
  ImFont *font;
  char *text;
  undefined1 auVar3 [16];
  float fVar4;
  ImGuiContext_conflict1 *pIVar5;
  ImRect *r;
  ImGuiWindow_conflict *pIVar6;
  ImU32 IVar7;
  ImGuiWindow_conflict **ppIVar8;
  char *text_end;
  uint idx;
  int i;
  int i_00;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  ImRect IVar12;
  ImRect local_b0;
  float local_9c;
  ImRect *local_98;
  ImGuiContext_conflict1 *local_90;
  ImRect local_88;
  ImVec2 *local_78;
  ImDrawList *local_70;
  ImGuiWindow_conflict *local_68;
  ImGuiViewportP_conflict *local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar5 = GImGui;
  local_68 = GImGui->CurrentWindow;
  local_48 = (bb->Min).x;
  fStack_44 = (bb->Min).y;
  auVar11._0_4_ = (bb->Max).x - local_48;
  auVar11._4_4_ = (bb->Max).y - fStack_44;
  auVar11._8_8_ = 0;
  IVar1 = (viewport->super_ImGuiViewport).Pos;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = (viewport->super_ImGuiViewport).Size.x;
  auVar3._4_4_ = (viewport->super_ImGuiViewport).Size.y;
  local_58 = divps(auVar11,auVar3);
  local_48 = local_48 - IVar1.x * local_58._0_4_;
  fStack_44 = fStack_44 - IVar1.y * local_58._4_4_;
  fStack_40 = 0.0 - local_58._8_4_ * 0.0;
  fStack_3c = 0.0 - local_58._12_4_ * 0.0;
  alpha_mul = *(float *)(&DAT_001f5130 +
                        (ulong)(((uint)(viewport->super_ImGuiViewport).Flags >> 10 & 1) == 0) * 4);
  pIVar2 = local_68->DrawList;
  local_70 = draw_list;
  IVar7 = GetColorU32(5,alpha_mul * 0.4);
  local_98 = bb;
  local_78 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar2,&bb->Min,&bb->Max,IVar7,0.0,0);
  local_90 = pIVar5;
  this = &pIVar5->Windows;
  local_60 = (ImGuiViewportP_conflict *)viewport;
  for (i_00 = 0; i_00 != this->Size; i_00 = i_00 + 1) {
    ppIVar8 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,i_00);
    this_00 = (ImGuiWindow *)*ppIVar8;
    if (((this_00->WasActive == true) && ((this_00->Flags & 0x1000000) == 0)) &&
       (this_00->Viewport == (ImGuiViewportP_conflict *)viewport)) {
      local_b0 = ImGuiWindow::Rect(this_00);
      IVar12 = ImGuiWindow::TitleBarRect(this_00);
      r = local_98;
      fVar9 = local_b0.Min.x;
      fVar10 = local_b0.Max.x;
      fVar4 = local_b0.Max.y;
      local_b0.Min.y = (float)(int)(local_b0.Min.y * (float)local_58._4_4_ + fStack_44);
      local_b0.Min.x = (float)(int)(fVar9 * (float)local_58._0_4_ + local_48);
      local_b0.Max.x = (float)(int)(fVar10 * (float)local_58._0_4_ + local_48);
      local_b0.Max.y = (float)(int)(fVar4 * (float)local_58._4_4_ + fStack_44);
      local_88.Min.x = (float)(int)(IVar12.Min.x * (float)local_58._0_4_ + local_48);
      local_88.Min.y = (float)(int)(IVar12.Min.y * (float)local_58._4_4_ + fStack_44);
      local_88.Max.x = (float)(int)(IVar12.Max.x * (float)local_58._0_4_ + local_48);
      local_88.Max.y = local_88.Min.y + 5.0;
      ImRect::ClipWithFull(&local_b0,local_98);
      ImRect::ClipWithFull(&local_88,r);
      pIVar6 = local_68;
      idx = 10;
      if (local_90->NavWindow != (ImGuiWindow_conflict *)0x0) {
        idx = this_00->RootWindowForTitleBarHighlight ==
              (ImGuiWindow *)local_90->NavWindow->RootWindowForTitleBarHighlight | 10;
      }
      pIVar2 = local_68->DrawList;
      IVar7 = GetColorU32(2,alpha_mul);
      ImDrawList::AddRectFilled(pIVar2,&local_b0.Min,&local_b0.Max,IVar7,0.0,0);
      pIVar2 = pIVar6->DrawList;
      IVar7 = GetColorU32(idx,alpha_mul);
      ImDrawList::AddRectFilled(pIVar2,&local_88.Min,&local_88.Max,IVar7,0.0,0);
      pIVar2 = pIVar6->DrawList;
      IVar7 = GetColorU32(5,alpha_mul);
      ImDrawList::AddRect(pIVar2,&local_b0.Min,&local_b0.Max,IVar7,0.0,0,1.0);
      pIVar2 = pIVar6->DrawList;
      font = local_90->Font;
      local_9c = local_90->FontSize;
      IVar7 = GetColorU32(0,alpha_mul);
      text = this_00->Name;
      text_end = FindRenderedTextEnd(text,(char *)0x0);
      ImDrawList::AddText(pIVar2,font,local_9c,&local_88.Min,IVar7,text,text_end,0.0,(ImVec4 *)0x0);
      viewport = (ImGuiViewportP_conflict1 *)local_60;
    }
  }
  IVar7 = GetColorU32(5,alpha_mul);
  ImDrawList::AddRect(local_70,&local_98->Min,local_78,IVar7,0.0,0,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = (viewport->Flags & ImGuiViewportFlags_Minimized) ? 0.30f : 1.00f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;
        if (thumb_window->Viewport != viewport)
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}